

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<std::complex<double>_>::TPZBlockDiagonal
          (TPZBlockDiagonal<std::complex<double>_> *this)

{
  TPZRegisterClassId *in_RDI;
  TPZVec<std::complex<double>_> *this_00;
  void **in_stack_ffffffffffffffc8;
  TPZMatrix<std::complex<double>_> *in_stack_ffffffffffffffd0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZBlockDiagonal<std::complex<double>>>(in_RDI,0x21);
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 0x12) = 0;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  TPZMatrix<std::complex<double>_>::TPZMatrix(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *(undefined ***)in_RDI = &PTR__TPZBlockDiagonal_023f1580;
  this_00 = (TPZVec<std::complex<double>_> *)(in_RDI + 0x20);
  TPZVec<std::complex<double>_>::TPZVec(this_00);
  TPZVec<long>::TPZVec((TPZVec<long> *)0x0,(int64_t)this_00,(long *)in_RDI);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x60));
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal()
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>(), fStorage(), fBlockPos(1,0),fBlockSize()
{
	
}